

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O1

int gost_mgm128_finish(mgm128_context *ctx,uchar *tag,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  block128_f p_Var4;
  mul128_f p_Var5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint64_t uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar13 = (ctx->len).u[0];
  uVar3 = (ctx->len).u[1];
  uVar1 = uVar13 * 8;
  uVar2 = uVar3 * 8;
  p_Var4 = ctx->block;
  p_Var5 = ctx->mul_gf;
  pvVar6 = ctx->key;
  iVar12 = ctx->blocklen;
  uVar14 = ctx->mres;
  if (((ulong)uVar14 != 0) || (ctx->ares != 0)) {
    memset((void *)((long)&ctx->ACi + (ulong)uVar14 + (ulong)ctx->ares),0,
           (ulong)(iVar12 - (uVar14 + ctx->ares)));
    (*p_Var4)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar6);
    (*p_Var5)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
    uVar14 = (ctx->mul).d[1];
    uVar7 = (ctx->mul).d[2];
    uVar8 = (ctx->mul).d[3];
    uVar9 = (ctx->sum).d[1];
    uVar10 = (ctx->sum).d[2];
    uVar11 = (ctx->sum).d[3];
    (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
    (ctx->sum).d[1] = uVar9 ^ uVar14;
    (ctx->sum).d[2] = uVar10 ^ uVar7;
    (ctx->sum).d[3] = uVar11 ^ uVar8;
    inc_counter((uchar *)(ctx->Zi).u,(long)(iVar12 / 2));
  }
  uVar14 = (uint)uVar13;
  uVar16 = uVar13 << 0x3b | uVar1 >> 0x38 | (ulong)(uVar14 & 0x1fe00000) << 0xb |
           (ulong)(uVar14 & 0x1fe000) << 0x1b | (ulong)(uVar14 & 0x1fe0) << 0x2b;
  uVar14 = (uint)uVar3;
  uVar15 = uVar3 << 0x3b | uVar2 >> 0x38 | (ulong)(uVar14 & 0x1fe00000) << 0xb |
           (ulong)(uVar14 & 0x1fe000) << 0x1b | (ulong)(uVar14 & 0x1fe0) << 0x2b |
           uVar2 >> 0x28 & 0xff00 | uVar2 >> 0x18 & 0xff0000 |
           (ulong)((uint)(uVar2 >> 8) & 0xff000000);
  uVar13 = 0;
  uVar2 = uVar16 >> 0x20 | uVar15;
  if (iVar12 == 0x10) {
    uVar13 = uVar15;
    uVar2 = uVar1 >> 0x28 & 0xff00 | uVar16 |
            (ulong)((uint)(uVar1 >> 8) & 0xff000000) | uVar1 >> 0x18 & 0xff0000;
  }
  (ctx->len).u[0] = uVar2;
  (ctx->len).u[1] = uVar13;
  (*p_Var4)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar6);
  (*p_Var5)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->len);
  uVar14 = (ctx->mul).d[1];
  uVar7 = (ctx->mul).d[2];
  uVar8 = (ctx->mul).d[3];
  uVar9 = (ctx->sum).d[1];
  uVar10 = (ctx->sum).d[2];
  uVar11 = (ctx->sum).d[3];
  (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
  (ctx->sum).d[1] = uVar9 ^ uVar14;
  (ctx->sum).d[2] = uVar10 ^ uVar7;
  (ctx->sum).d[3] = uVar11 ^ uVar8;
  (*p_Var4)((uchar *)&ctx->sum,(uchar *)&ctx->tag,pvVar6);
  if (0x10 < len || tag == (uchar *)0x0) {
    return -1;
  }
  iVar12 = CRYPTO_memcmp(&ctx->tag,tag,len);
  return iVar12;
}

Assistant:

int gost_mgm128_finish(mgm128_context *ctx, const unsigned char *tag,
                         size_t len)
{
    uint64_t alen = ctx->len.u[0] << 3;
    uint64_t clen = ctx->len.u[1] << 3;
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->mres || ctx->ares) {
        /* First call to encrypt finalizes AAD/ENC */
        memset(ctx->ACi.c + ctx->ares + ctx->mres, 0, bl - (ctx->ares + ctx->mres));
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) [A_i or C_i]
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                         // Z_{i+1} = incr_l(Z_i)
    }

#ifdef L_ENDIAN
    alen = BSWAP64(alen);
    clen = BSWAP64(clen);
#endif
    if (bl == 16) {
        ctx->len.u[0] = alen;
        ctx->len.u[1] = clen;
    } else {
#ifdef L_ENDIAN
        ctx->len.u[0] = (alen >> 32) | clen;
#else
        ctx->len.u[0] = (alen << 32) | clen;
#endif
        ctx->len.u[1] = 0;
    }

    (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
    mul_gf(ctx->mul.u, ctx->Hi.u, ctx->len.u);              // H_i (x) (len(A) || len(C))
    grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
    (*block) (ctx->sum.c, ctx->tag.c, key);                 // E_K(sum)

    if (tag && len <= sizeof(ctx->tag))
        return CRYPTO_memcmp(ctx->tag.c, tag, len);         // MSB_S(E_K(sum))
    else
        return -1;
}